

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# icuid_tool.c
# Opt level: O2

int main(int argc,char **argv)

{
  FILE *__stream;
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  FILE *__stream_00;
  long lVar4;
  cpuid_data_t data;
  cpuid_raw_data_t raw;
  
  icuid_opts.out = (char *)0x0;
  icuid_opts.dump = (char *)0x0;
  icuid_opts.data = (char *)0x0;
  icuid_opts.help = 0;
  icuid_opts._28_4_ = 0;
  iVar1 = options_parse(argc,argv,icuid_options,(char **)0x0);
  if (iVar1 == 0) {
    if (icuid_opts.help != 0) {
      usage();
      return 0;
    }
    out = _stdout;
    if ((icuid_opts.out == (char *)0x0) ||
       (out = (FILE *)fopen(icuid_opts.out,"w"), (FILE *)out != (FILE *)0x0)) {
      if (icuid_opts.dump == (char *)0x0) {
        if (icuid_opts.data == (char *)0x0) {
          iVar1 = cpuid_get_raw_data(&raw);
        }
        else {
          iVar1 = cpuid_serialize_raw_data(&raw,icuid_opts.data);
        }
        if (iVar1 == 0) {
          icuid_identify(&raw,&data);
          fwrite("ICUID - 1.4.1\n",0xe,1,(FILE *)out);
          fwrite("Copyright (c) 2015 - 2016, Kurt Cancemi (kurt@x64architecture.com)\n",0x43,1,
                 (FILE *)out);
          fwrite("===============================\n",0x20,1,(FILE *)out);
          fprintf((FILE *)out," Vendor      : %s\n",&data);
          fprintf((FILE *)out," Vendor ID   : %u\n",(ulong)data.vendor);
          fprintf((FILE *)out," CPU         : %s\n",data.brand_str);
          fprintf((FILE *)out," Cores       : %u\n",(ulong)data.cores);
          fprintf((FILE *)out," Logical     : %u\n",(ulong)data.logical_cpus);
          fprintf((FILE *)out," Codename    : %s\n",data.codename);
          fprintf((FILE *)out," Family      : %u\n",(ulong)data.family);
          fprintf((FILE *)out," Model       : %u\n",(ulong)data.model);
          fprintf((FILE *)out," Stepping    : %u\n",(ulong)data.stepping);
          fprintf((FILE *)out," Type        : %u\n",(ulong)data.type);
          fprintf((FILE *)out," Ext Family  : %u\n",(ulong)data.ext_family);
          fprintf((FILE *)out," Ext Model   : %u\n",(ulong)data.ext_model);
          fprintf((FILE *)out," Signature   : 0x%0x\n",(ulong)data.signature);
          fprintf((FILE *)out," L1 D Cache  : %uKB\n",(ulong)data.l1_data_cache);
          fprintf((FILE *)out," L1 I Cache  : %uKB\n",(ulong)data.l1_instruction_cache);
          fprintf((FILE *)out," L2 Cache    : %uKB\n",(ulong)data.l2_cache);
          fprintf((FILE *)out," L3 Cache    : %uKB\n",(ulong)data.l3_cache);
          fprintf((FILE *)out," L4 Cache    : %uKB\n",(ulong)data.l4_cache);
          fprintf((FILE *)out," L1 Assoc.   : %u-way\n",(ulong)data.l1_associativity);
          fprintf((FILE *)out," L2 Assoc.   : %u-way\n",(ulong)data.l2_associativity);
          fprintf((FILE *)out," L3 Assoc.   : %u-way\n",(ulong)data.l3_associativity);
          fprintf((FILE *)out," L4 Assoc.   : %u-way\n",(ulong)data.l4_associativity);
          fprintf((FILE *)out," L1 Line sz  : %u bytes\n",(ulong)data.l1_cacheline);
          fprintf((FILE *)out," L2 Line sz  : %u bytes\n",(ulong)data.l2_cacheline);
          fprintf((FILE *)out," L3 Line sz  : %u bytes\n",(ulong)data.l3_cacheline);
          fprintf((FILE *)out," L4 Line sz  : %u bytes\n",(ulong)data.l4_cacheline);
          fprintf((FILE *)out," Address szs : %u bits physical, %u bits virtual\n",
                  (ulong)data.physical_address_bits,(ulong)data.virtual_address_bits);
          pcVar3 = "Disabled";
          pcVar2 = "Disabled";
          if (data.xfeatures[1] == '\x01') {
            pcVar2 = "Enabled";
          }
          fprintf((FILE *)out," SSE State   : %s\n",pcVar2);
          if (data.xfeatures[2] == '\x01') {
            pcVar3 = "Enabled";
          }
          fprintf((FILE *)out," AVX State   : %s\n",pcVar3);
          fwrite(" Features    :",0xe,1,(FILE *)out);
          for (lVar4 = 0; __stream = out, lVar4 != 0xb9; lVar4 = lVar4 + 1) {
            if (data.flags[lVar4] != '\0') {
              pcVar2 = cpu_feature_str((cpuid_feature_t)lVar4);
              fprintf((FILE *)__stream," %s",pcVar2);
            }
          }
          fputc(10,(FILE *)out);
          if (icuid_opts.out != (char *)0x0) {
            fclose((FILE *)out);
            return 0;
          }
          return 0;
        }
      }
      else {
        iVar1 = cpuid_deserialize_raw_data(&raw,icuid_opts.dump);
        if (iVar1 == 0) {
          return 0;
        }
      }
      __stream_00 = (FILE *)out;
      pcVar2 = icuid_errorstr(iVar1);
      pcVar3 = "%s\n";
    }
    else {
      pcVar3 = "Can\'t open file %s\n";
      pcVar2 = icuid_opts.out;
      __stream_00 = _stderr;
    }
    fprintf(__stream_00,pcVar3,pcVar2);
  }
  else {
    usage();
  }
  return -1;
}

Assistant:

int main(int argc, char **argv)
{
    int ret = -1;
    cpuid_raw_data_t raw;
    cpuid_data_t data;

    memset(&icuid_opts, 0, sizeof(icuid_opts));

    if (options_parse(argc, argv, icuid_options, NULL) != 0) {
        usage();
        return -1;
    }

    if (icuid_opts.help) {
        usage();
        return 0;
    }

    out = stdout;
    if (icuid_opts.out != NULL) {
        if ((out = fopen(icuid_opts.out, "w")) == NULL) {
            fprintf(stderr, "Can't open file %s\n", icuid_opts.out);
            return -1;
        }
    }

    if (icuid_opts.dump != NULL) {
        ret = cpuid_deserialize_raw_data(&raw, icuid_opts.dump);
        if (ret != ICUID_OK) {
            fprintf(out, "%s\n", icuid_errorstr(ret));
            return -1;
        }
        return 0;
    }

    if (icuid_opts.data != NULL) {
        ret = cpuid_serialize_raw_data(&raw, icuid_opts.data);
        if (ret != ICUID_OK) {
            fprintf(out, "%s\n", icuid_errorstr(ret));
            return -1;
        }
    } else {
        ret = cpuid_get_raw_data(&raw);
        if (ret != ICUID_OK) {
            fprintf(out, "%s\n", icuid_errorstr(ret));
            return -1;
        }
    }

    ret = print_summary(&raw, &data);

    if (icuid_opts.out != NULL)
        fclose(out);

    return ret;
}